

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

EnumValueOptions * __thiscall
google::protobuf::EnumValueDescriptorProto::_internal_mutable_options
          (EnumValueDescriptorProto *this)

{
  Arena *arena;
  EnumValueOptions *pEVar1;
  EnumValueOptions *p;
  EnumValueDescriptorProto *this_local;
  
  if ((this->field_0)._impl_.options_ == (EnumValueOptions *)0x0) {
    arena = MessageLite::GetArena((MessageLite *)this);
    pEVar1 = (EnumValueOptions *)Arena::DefaultConstruct<google::protobuf::EnumValueOptions>(arena);
    (this->field_0)._impl_.options_ = pEVar1;
  }
  return (this->field_0)._impl_.options_;
}

Assistant:

inline ::google::protobuf::EnumValueOptions* PROTOBUF_NONNULL EnumValueDescriptorProto::_internal_mutable_options() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.options_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::google::protobuf::EnumValueOptions>(GetArena());
    _impl_.options_ = reinterpret_cast<::google::protobuf::EnumValueOptions*>(p);
  }
  return _impl_.options_;
}